

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  long *plVar3;
  char *pcVar4;
  int extraout_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_RBX;
  char *unaff_R14;
  FileInputSource is;
  undefined1 local_130 [16];
  string local_120;
  FileInputSource local_100;
  
  if (argc - 4U < 0xfffffffe) {
LAB_0011d069:
    usage();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
    }
    FileInputSource::~FileInputSource(&local_100);
    if (extraout_EDX != 1) {
      if (unaff_RBX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_RBX);
      }
      _Unwind_Resume(extraout_RAX);
    }
    plVar3 = (long *)__cxa_begin_catch(extraout_RAX);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"exception: ",0xb);
    poVar2 = std::operator<<((ostream *)&std::cerr,unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    pcVar4 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 2;
    __cxa_end_catch();
  }
  else {
    unaff_R14 = argv[1];
    if (argc == 3) {
      iVar1 = strcmp(argv[2],"--react");
      if (iVar1 != 0) goto LAB_0011d069;
      unaff_RBX = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      unaff_RBX->_M_use_count = 1;
      unaff_RBX->_M_weak_count = 1;
      unaff_RBX->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaa0;
      unaff_RBX[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Reactor_002eaaf0;
    }
    else {
      unaff_RBX = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    FileInputSource::FileInputSource(&local_100,unaff_R14);
    JSON::parse((InputSource *)local_130,(Reactor *)&local_100);
    JSON::unparse_abi_cxx11_(&local_120,(JSON *)local_130);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_120._M_dataplus._M_p,local_120._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
    }
    FileInputSource::~FileInputSource(&local_100);
    iVar1 = 0;
  }
  if (unaff_RBX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_RBX);
  }
  return iVar1;
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((argc < 2) || (argc > 3)) {
        usage();
        return 2;
    }
    char const* filename = argv[1];
    std::shared_ptr<Reactor> reactor;
    if (argc == 3) {
        if (strcmp(argv[2], "--react") == 0) {
            reactor = std::make_shared<Reactor>();
        } else {
            usage();
        }
    }
    try {
        FileInputSource is(filename);
        std::cout << JSON::parse(is, reactor.get()).unparse() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << filename << ": " << e.what() << std::endl;
        return 2;
    }
    return 0;
}